

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O0

void __thiscall
btCollisionWorld::debugDrawObject
          (btCollisionWorld *this,btTransform *worldTransform,btCollisionShape *shape,
          btVector3 *color)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long *plVar6;
  btScalar *pbVar7;
  btConvexPolyhedron *pbVar8;
  btFace *pbVar9;
  int *piVar10;
  btVector3 *pbVar11;
  btFace *pbVar12;
  btFace *pbVar13;
  btStridingMeshInterface *pbVar14;
  undefined8 in_RCX;
  btConvexTriangleMeshShape *in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined4 extraout_XMM0_Da;
  btScalar bVar15;
  undefined4 extraout_XMM0_Da_00;
  DebugDrawcallback drawCallback_1;
  btVector3 aabbMin_1;
  btVector3 aabbMax_1;
  btConvexTriangleMeshShape *convexMesh;
  DebugDrawcallback drawCallback;
  btVector3 aabbMin;
  btVector3 aabbMax;
  btConcaveShape *concaveMesh;
  btVector3 wb;
  btVector3 wa;
  btVector3 b;
  btVector3 a;
  btVector3 faceNormal;
  btVector3 normalColor;
  int curVert;
  int v;
  int lastV;
  int numVerts;
  btVector3 centroid;
  btConvexPolyhedron *poly;
  int i_2;
  btPolyhedralConvexShape *polyshape;
  btVector3 *planeNormal;
  btScalar planeConst;
  btStaticPlaneShape *staticPlaneShape;
  btScalar halfHeight_1;
  btScalar radius_3;
  int upAxis_2;
  btCylinderShape *cylinder;
  int upAxis_1;
  btScalar height;
  btScalar radius_2;
  btConeShape *coneShape;
  int upAxis;
  btScalar halfHeight;
  btScalar radius_1;
  btCapsuleShape *capsuleShape;
  int i_1;
  btTransform childTransform;
  btMultiSphereShape *multiSphereShape;
  btScalar radius;
  btSphereShape *sphereShape;
  btVector3 halfExtents;
  btBoxShape *boxShape;
  btCollisionShape *colShape;
  btTransform childTrans;
  int i;
  btCompoundShape *compoundShape;
  undefined4 in_stack_fffffffffffffae8;
  int in_stack_fffffffffffffaec;
  btMultiSphereShape *in_stack_fffffffffffffaf0;
  DebugDrawcallback *this_00;
  btVector3 *in_stack_fffffffffffffaf8;
  btTransform *in_stack_fffffffffffffb00;
  btVector3 *in_stack_fffffffffffffb08;
  DebugDrawcallback *in_stack_fffffffffffffb10;
  btBoxShape *in_stack_fffffffffffffb18;
  btTransform *in_stack_fffffffffffffb40;
  btTransform *in_stack_fffffffffffffb48;
  DebugDrawcallback DStack_450;
  btScalar local_3e8;
  btVector3 local_3e4;
  btScalar local_3d4;
  btScalar local_3d0;
  btScalar local_3cc;
  btVector3 local_3c8;
  btConvexTriangleMeshShape *local_3b8;
  btTransform local_3a0;
  btScalar local_338;
  btScalar local_334;
  btScalar local_330;
  btVector3 local_32c;
  btScalar local_31c;
  btScalar local_318;
  btScalar local_314;
  undefined1 local_310 [108];
  btScalar local_2a4 [4];
  btScalar local_294 [4];
  btVector3 local_284;
  btScalar local_274;
  btScalar local_270;
  btScalar local_26c;
  btVector3 local_268;
  float local_258;
  btScalar local_254 [4];
  btScalar local_244 [4];
  int local_234;
  int local_230;
  int local_22c;
  int local_228;
  btScalar local_224;
  btScalar local_220;
  btScalar local_21c;
  btVector3 local_218;
  btConvexPolyhedron *local_208;
  uint local_1fc;
  btConvexTriangleMeshShape *local_1f8;
  btVector3 *local_1f0;
  btScalar local_1e4;
  btConvexTriangleMeshShape *local_1e0;
  btVector3 local_1d4;
  btScalar local_1c4;
  undefined4 local_1c0;
  int local_1bc;
  btConvexTriangleMeshShape *local_1b8;
  int local_1ac;
  btScalar local_1a8;
  btScalar local_1a4;
  btConvexTriangleMeshShape *local_1a0;
  int local_194;
  btScalar local_190;
  btScalar local_18c;
  btConvexTriangleMeshShape *local_188;
  undefined1 local_17c [64];
  int local_13c;
  btTransform local_138;
  btConvexTriangleMeshShape *local_f8;
  undefined4 local_ec;
  btConvexTriangleMeshShape *local_e8;
  btScalar local_e0 [4];
  btScalar local_d0 [4];
  btConvexTriangleMeshShape *local_c0;
  undefined1 local_b8 [64];
  btCollisionShape *local_78;
  int local_2c;
  btConvexTriangleMeshShape *local_28;
  undefined8 local_20;
  btConvexTriangleMeshShape *local_18;
  undefined8 local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  lVar5 = (**(code **)(*in_RDI + 0x28))();
  if (lVar5 != 0) {
    plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
    uVar2 = (**(code **)(*plVar6 + 0x70))();
    if ((uVar2 & 0x8000) != 0) {
      plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
      (**(code **)(*plVar6 + 0x80))(0x3f800000,plVar6,local_10);
    }
  }
  iVar3 = btCollisionShape::getShapeType((btCollisionShape *)local_18);
  if (iVar3 == 0x1f) {
    local_28 = local_18;
    local_2c = btCompoundShape::getNumChildShapes((btCompoundShape *)0x17d021);
    while (local_2c = local_2c + -1, -1 < local_2c) {
      btCompoundShape::getChildTransform
                ((btCompoundShape *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
      btTransform::btTransform
                ((btTransform *)in_stack_fffffffffffffaf0,
                 (btTransform *)CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
      local_78 = btCompoundShape::getChildShape
                           ((btCompoundShape *)in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
      btTransform::operator*(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
      (**(code **)(*in_RDI + 0x38))(in_RDI,local_b8,local_78,local_20);
    }
  }
  else {
    iVar3 = btCollisionShape::getShapeType((btCollisionShape *)local_18);
    switch(iVar3) {
    case 0:
      local_c0 = local_18;
      local_d0 = (btScalar  [4])btBoxShape::getHalfExtentsWithMargin(in_stack_fffffffffffffb18);
      plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
      local_e0 = (btScalar  [4])operator-((btVector3 *)in_stack_fffffffffffffaf0);
      (**(code **)(*plVar6 + 0xa0))(plVar6,local_e0,local_d0,local_10,local_20);
      break;
    default:
      bVar1 = btCollisionShape::isPolyhedral((btCollisionShape *)0x17d594);
      if (bVar1) {
        local_1f8 = local_18;
        pbVar8 = btPolyhedralConvexShape::getConvexPolyhedron((btPolyhedralConvexShape *)local_18);
        if (pbVar8 == (btConvexPolyhedron *)0x0) {
          for (local_1fc = 0; uVar2 = local_1fc,
              iVar3 = (*(local_1f8->super_btPolyhedralConvexAabbCachingShape).
                        super_btPolyhedralConvexShape.super_btConvexInternalShape.
                        super_btConvexShape.super_btCollisionShape._vptr_btCollisionShape[0x19])(),
              (int)uVar2 < iVar3; local_1fc = local_1fc + 1) {
            pbVar11 = (btVector3 *)(local_310 + 0x4c);
            btVector3::btVector3(pbVar11);
            btVector3::btVector3((btVector3 *)(local_310 + 0x3c));
            (*(local_1f8->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
              super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.
              _vptr_btCollisionShape[0x1a])
                      (local_1f8,(ulong)local_1fc,pbVar11,(btVector3 *)(local_310 + 0x3c));
            local_310._44_16_ =
                 (undefined1  [16])
                 btTransform::operator*
                           ((btTransform *)in_stack_fffffffffffffaf0,
                            (btVector3 *)
                            CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
            local_310._28_16_ =
                 (undefined1  [16])
                 btTransform::operator*
                           ((btTransform *)in_stack_fffffffffffffaf0,
                            (btVector3 *)
                            CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
            plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
            (**(code **)(*plVar6 + 0x20))(plVar6,local_310 + 0x2c,local_310 + 0x1c,local_20);
          }
        }
        else {
          local_208 = btPolyhedralConvexShape::getConvexPolyhedron
                                ((btPolyhedralConvexShape *)local_1f8);
          for (local_1fc = 0; uVar2 = local_1fc,
              iVar3 = btAlignedObjectArray<btFace>::size(&local_208->m_faces), (int)uVar2 < iVar3;
              local_1fc = local_1fc + 1) {
            local_21c = 0.0;
            local_220 = 0.0;
            local_224 = 0.0;
            btVector3::btVector3(&local_218,&local_21c,&local_220,&local_224);
            pbVar9 = btAlignedObjectArray<btFace>::operator[](&local_208->m_faces,local_1fc);
            local_228 = btAlignedObjectArray<int>::size(&pbVar9->m_indices);
            if (local_228 != 0) {
              pbVar9 = btAlignedObjectArray<btFace>::operator[](&local_208->m_faces,local_1fc);
              piVar10 = btAlignedObjectArray<int>::operator[](&pbVar9->m_indices,local_228 + -1);
              local_22c = *piVar10;
              local_230 = 0;
              while( true ) {
                iVar3 = local_230;
                pbVar9 = btAlignedObjectArray<btFace>::operator[](&local_208->m_faces,local_1fc);
                iVar4 = btAlignedObjectArray<int>::size(&pbVar9->m_indices);
                if (iVar4 <= iVar3) break;
                pbVar9 = btAlignedObjectArray<btFace>::operator[](&local_208->m_faces,local_1fc);
                piVar10 = btAlignedObjectArray<int>::operator[](&pbVar9->m_indices,local_230);
                local_234 = *piVar10;
                pbVar11 = btAlignedObjectArray<btVector3>::operator[]
                                    (&local_208->m_vertices,local_234);
                btVector3::operator+=(&local_218,pbVar11);
                plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
                btAlignedObjectArray<btVector3>::operator[](&local_208->m_vertices,local_22c);
                local_244 = (btScalar  [4])
                            btTransform::operator*
                                      ((btTransform *)in_stack_fffffffffffffaf0,
                                       (btVector3 *)
                                       CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)
                                      );
                btAlignedObjectArray<btVector3>::operator[](&local_208->m_vertices,local_234);
                local_254 = (btScalar  [4])
                            btTransform::operator*
                                      ((btTransform *)in_stack_fffffffffffffaf0,
                                       (btVector3 *)
                                       CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8)
                                      );
                (**(code **)(*plVar6 + 0x20))(plVar6,local_244,local_254,local_20);
                local_22c = local_234;
                local_230 = local_230 + 1;
              }
            }
            local_258 = 1.0 / (float)local_228;
            btVector3::operator*=(&local_218,&local_258);
            plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
            uVar2 = (**(code **)(*plVar6 + 0x70))();
            if ((uVar2 & 0x4000) != 0) {
              local_26c = 1.0;
              local_270 = 1.0;
              local_274 = 0.0;
              btVector3::btVector3(&local_268,&local_26c,&local_270,&local_274);
              pbVar9 = btAlignedObjectArray<btFace>::operator[](&local_208->m_faces,local_1fc);
              pbVar12 = btAlignedObjectArray<btFace>::operator[](&local_208->m_faces,local_1fc);
              pbVar13 = btAlignedObjectArray<btFace>::operator[](&local_208->m_faces,local_1fc);
              btVector3::btVector3
                        (&local_284,pbVar9->m_plane,pbVar12->m_plane + 1,pbVar13->m_plane + 2);
              plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
              local_294 = (btScalar  [4])
                          btTransform::operator*
                                    ((btTransform *)in_stack_fffffffffffffaf0,
                                     (btVector3 *)
                                     CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
              local_310._92_16_ =
                   (undefined1  [16])
                   operator+((btVector3 *)in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
              local_2a4 = (btScalar  [4])
                          btTransform::operator*
                                    ((btTransform *)in_stack_fffffffffffffaf0,
                                     (btVector3 *)
                                     CONCAT44(in_stack_fffffffffffffaec,in_stack_fffffffffffffae8));
              (**(code **)(*plVar6 + 0x20))(plVar6,local_294,local_2a4,&local_268);
            }
          }
        }
      }
      bVar1 = btCollisionShape::isConcave((btCollisionShape *)0x17db65);
      if (bVar1) {
        local_310._16_8_ = local_18;
        local_314 = 1e+18;
        local_318 = 1e+18;
        local_31c = 1e+18;
        in_stack_fffffffffffffb10 = (DebugDrawcallback *)local_310;
        btVector3::btVector3
                  ((btVector3 *)in_stack_fffffffffffffb10,&local_314,&local_318,&local_31c);
        local_330 = -1e+18;
        local_334 = -1e+18;
        local_338 = -1e+18;
        in_stack_fffffffffffffb08 = &local_32c;
        btVector3::btVector3(in_stack_fffffffffffffb08,&local_330,&local_334,&local_338);
        (**(code **)(*in_RDI + 0x28))();
        in_stack_fffffffffffffb00 = &local_3a0;
        DebugDrawcallback::DebugDrawcallback
                  (in_stack_fffffffffffffb10,(btIDebugDraw *)in_stack_fffffffffffffb08,
                   in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
        (*(((btPolyhedralConvexAabbCachingShape *)local_310._16_8_)->super_btPolyhedralConvexShape).
          super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.
          _vptr_btCollisionShape[0x10])
                  (local_310._16_8_,in_stack_fffffffffffffb00,in_stack_fffffffffffffb08,
                   in_stack_fffffffffffffb10);
        DebugDrawcallback::~DebugDrawcallback((DebugDrawcallback *)in_stack_fffffffffffffaf0);
      }
      iVar3 = btCollisionShape::getShapeType((btCollisionShape *)local_18);
      if (iVar3 == 3) {
        local_3b8 = local_18;
        local_3cc = 1e+18;
        local_3d0 = 1e+18;
        local_3d4 = 1e+18;
        btVector3::btVector3(&local_3c8,&local_3cc,&local_3d0,&local_3d4);
        local_3e8 = -1e+18;
        DStack_450.m_worldTrans.m_origin.m_floats[3] = -1e+18;
        DStack_450.m_worldTrans.m_origin.m_floats[2] = -1e+18;
        btVector3::btVector3
                  (&local_3e4,&local_3e8,DStack_450.m_worldTrans.m_origin.m_floats + 3,
                   DStack_450.m_worldTrans.m_origin.m_floats + 2);
        (**(code **)(*in_RDI + 0x28))();
        DebugDrawcallback::DebugDrawcallback
                  (in_stack_fffffffffffffb10,(btIDebugDraw *)in_stack_fffffffffffffb08,
                   in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
        pbVar14 = btConvexTriangleMeshShape::getMeshInterface(local_3b8);
        this_00 = (DebugDrawcallback *)0x0;
        if (&stack0x00000000 != (undefined1 *)0x458) {
          this_00 = &DStack_450;
        }
        (*pbVar14->_vptr_btStridingMeshInterface[2])(pbVar14,this_00,&local_3e4,&local_3c8);
        DebugDrawcallback::~DebugDrawcallback(this_00);
      }
      break;
    case 8:
      local_e8 = local_18;
      (*(local_18->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
        super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.
        _vptr_btCollisionShape[0xc])();
      local_ec = extraout_XMM0_Da;
      plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
      (**(code **)(*plVar6 + 0x30))(local_ec,plVar6,local_10,local_20);
      break;
    case 9:
      local_f8 = local_18;
      btTransform::btTransform((btTransform *)in_stack_fffffffffffffaf0);
      btTransform::setIdentity(in_stack_fffffffffffffb00);
      local_13c = btMultiSphereShape::getSphereCount((btMultiSphereShape *)0x17d23f);
      while (local_13c = local_13c + -1, -1 < local_13c) {
        pbVar11 = btMultiSphereShape::getSpherePosition
                            (in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
        btTransform::setOrigin(&local_138,pbVar11);
        plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
        bVar15 = btMultiSphereShape::getSphereRadius
                           (in_stack_fffffffffffffaf0,in_stack_fffffffffffffaec);
        btTransform::operator*(in_stack_fffffffffffffb48,in_stack_fffffffffffffb40);
        (**(code **)(*plVar6 + 0x30))(bVar15,plVar6,local_17c,local_20);
      }
      break;
    case 10:
      local_188 = local_18;
      local_18c = btCapsuleShape::getRadius((btCapsuleShape *)in_stack_fffffffffffffaf0);
      local_190 = btCapsuleShape::getHalfHeight((btCapsuleShape *)in_stack_fffffffffffffaf0);
      local_194 = btCapsuleShape::getUpAxis((btCapsuleShape *)local_188);
      plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
      (**(code **)(*plVar6 + 0xa8))(local_18c,local_190,plVar6,local_194,local_10,local_20);
      break;
    case 0xb:
      local_1a0 = local_18;
      local_1a4 = btConeShape::getRadius((btConeShape *)local_18);
      local_1a8 = btConeShape::getHeight((btConeShape *)local_1a0);
      local_1ac = btConeShape::getConeUpIndex((btConeShape *)local_1a0);
      plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
      (**(code **)(*plVar6 + 0xb8))(local_1a4,local_1a8,plVar6,local_1ac,local_10,local_20);
      break;
    case 0xd:
      local_1b8 = local_18;
      local_1bc = btCylinderShape::getUpAxis((btCylinderShape *)local_18);
      (*(local_1b8->super_btPolyhedralConvexAabbCachingShape).super_btPolyhedralConvexShape.
        super_btConvexInternalShape.super_btConvexShape.super_btCollisionShape.
        _vptr_btCollisionShape[0x17])();
      local_1c0 = extraout_XMM0_Da_00;
      local_1d4 = btCylinderShape::getHalfExtentsWithMargin
                            ((btCylinderShape *)in_stack_fffffffffffffb18);
      pbVar7 = btVector3::operator_cast_to_float_(&local_1d4);
      local_1c4 = pbVar7[local_1bc];
      plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
      (**(code **)(*plVar6 + 0xb0))(local_1c0,local_1c4,plVar6,local_1bc,local_10,local_20);
      break;
    case 0x1c:
      local_1e0 = local_18;
      pbVar7 = btStaticPlaneShape::getPlaneConstant((btStaticPlaneShape *)local_18);
      local_1e4 = *pbVar7;
      local_1f0 = btStaticPlaneShape::getPlaneNormal((btStaticPlaneShape *)local_1e0);
      plVar6 = (long *)(**(code **)(*in_RDI + 0x28))();
      (**(code **)(*plVar6 + 0xc0))(local_1e4,plVar6,local_1f0,local_10,local_20);
    }
  }
  return;
}

Assistant:

void btCollisionWorld::debugDrawObject(const btTransform& worldTransform, const btCollisionShape* shape, const btVector3& color)
{
	// Draw a small simplex at the center of the object
	if (getDebugDrawer() && getDebugDrawer()->getDebugMode() & btIDebugDraw::DBG_DrawFrames)
	{
		getDebugDrawer()->drawTransform(worldTransform,1);
	}

	if (shape->getShapeType() == COMPOUND_SHAPE_PROXYTYPE)
	{
		const btCompoundShape* compoundShape = static_cast<const btCompoundShape*>(shape);
		for (int i=compoundShape->getNumChildShapes()-1;i>=0;i--)
		{
			btTransform childTrans = compoundShape->getChildTransform(i);
			const btCollisionShape* colShape = compoundShape->getChildShape(i);
			debugDrawObject(worldTransform*childTrans,colShape,color);
		}

	} else
	{

        switch (shape->getShapeType())
        {

        case BOX_SHAPE_PROXYTYPE:
            {
                const btBoxShape* boxShape = static_cast<const btBoxShape*>(shape);
                btVector3 halfExtents = boxShape->getHalfExtentsWithMargin();
                getDebugDrawer()->drawBox(-halfExtents,halfExtents,worldTransform,color);
                break;
            }

        case SPHERE_SHAPE_PROXYTYPE:
            {
                const btSphereShape* sphereShape = static_cast<const btSphereShape*>(shape);
                btScalar radius = sphereShape->getMargin();//radius doesn't include the margin, so draw with margin

                getDebugDrawer()->drawSphere(radius, worldTransform, color);
                break;
            }
        case MULTI_SPHERE_SHAPE_PROXYTYPE:
            {
                const btMultiSphereShape* multiSphereShape = static_cast<const btMultiSphereShape*>(shape);

                btTransform childTransform;
                childTransform.setIdentity();

                for (int i = multiSphereShape->getSphereCount()-1; i>=0;i--)
                {
                    childTransform.setOrigin(multiSphereShape->getSpherePosition(i));
                    getDebugDrawer()->drawSphere(multiSphereShape->getSphereRadius(i), worldTransform*childTransform, color);
                }

                break;
            }
        case CAPSULE_SHAPE_PROXYTYPE:
            {
                const btCapsuleShape* capsuleShape = static_cast<const btCapsuleShape*>(shape);

                btScalar radius = capsuleShape->getRadius();
                btScalar halfHeight = capsuleShape->getHalfHeight();

                int upAxis = capsuleShape->getUpAxis();
                getDebugDrawer()->drawCapsule(radius, halfHeight, upAxis, worldTransform, color);
                break;
            }
        case CONE_SHAPE_PROXYTYPE:
            {
                const btConeShape* coneShape = static_cast<const btConeShape*>(shape);
                btScalar radius = coneShape->getRadius();//+coneShape->getMargin();
                btScalar height = coneShape->getHeight();//+coneShape->getMargin();

                int upAxis= coneShape->getConeUpIndex();
                getDebugDrawer()->drawCone(radius, height, upAxis, worldTransform, color);
                break;

            }
        case CYLINDER_SHAPE_PROXYTYPE:
            {
                const btCylinderShape* cylinder = static_cast<const btCylinderShape*>(shape);
                int upAxis = cylinder->getUpAxis();
                btScalar radius = cylinder->getRadius();
                btScalar halfHeight = cylinder->getHalfExtentsWithMargin()[upAxis];
                getDebugDrawer()->drawCylinder(radius, halfHeight, upAxis, worldTransform, color);
                break;
            }

        case STATIC_PLANE_PROXYTYPE:
            {
                const btStaticPlaneShape* staticPlaneShape = static_cast<const btStaticPlaneShape*>(shape);
                btScalar planeConst = staticPlaneShape->getPlaneConstant();
                const btVector3& planeNormal = staticPlaneShape->getPlaneNormal();
                getDebugDrawer()->drawPlane(planeNormal, planeConst,worldTransform, color);
                break;

            }
        default:
            {

                /// for polyhedral shapes
                if (shape->isPolyhedral())
                {
                    btPolyhedralConvexShape* polyshape = (btPolyhedralConvexShape*) shape;
                    
                    int i;
                    if (polyshape->getConvexPolyhedron())
                    {
                        const btConvexPolyhedron* poly = polyshape->getConvexPolyhedron();
                        for (i=0;i<poly->m_faces.size();i++)
                        {
                            btVector3 centroid(0,0,0);
                            int numVerts = poly->m_faces[i].m_indices.size();
                            if (numVerts)
                            {
                                int lastV = poly->m_faces[i].m_indices[numVerts-1];
                                for (int v=0;v<poly->m_faces[i].m_indices.size();v++)
                                {
                                    int curVert = poly->m_faces[i].m_indices[v];
                                    centroid+=poly->m_vertices[curVert];
                                    getDebugDrawer()->drawLine(worldTransform*poly->m_vertices[lastV],worldTransform*poly->m_vertices[curVert],color);
                                    lastV = curVert;
                                }
                            }
                            centroid*= btScalar(1.f)/btScalar(numVerts);
                            if (getDebugDrawer()->getDebugMode() & btIDebugDraw::DBG_DrawNormals)
                            {
                                btVector3 normalColor(1,1,0);
                                btVector3 faceNormal(poly->m_faces[i].m_plane[0],poly->m_faces[i].m_plane[1],poly->m_faces[i].m_plane[2]);
                                getDebugDrawer()->drawLine(worldTransform*centroid,worldTransform*(centroid+faceNormal),normalColor);
                            }
                            
                        }
                        
                        
                    } else
                    {
                        for (i=0;i<polyshape->getNumEdges();i++)
                        {
                            btVector3 a,b;
                            polyshape->getEdge(i,a,b);
                            btVector3 wa = worldTransform * a;
                            btVector3 wb = worldTransform * b;
                            getDebugDrawer()->drawLine(wa,wb,color);
                        }
                    }
                    
                    
                }
                    
                if (shape->isConcave())
                {
                    btConcaveShape* concaveMesh = (btConcaveShape*) shape;

                    ///@todo pass camera, for some culling? no -> we are not a graphics lib
                    btVector3 aabbMax(btScalar(BT_LARGE_FLOAT),btScalar(BT_LARGE_FLOAT),btScalar(BT_LARGE_FLOAT));
                    btVector3 aabbMin(btScalar(-BT_LARGE_FLOAT),btScalar(-BT_LARGE_FLOAT),btScalar(-BT_LARGE_FLOAT));

                    DebugDrawcallback drawCallback(getDebugDrawer(),worldTransform,color);
                    concaveMesh->processAllTriangles(&drawCallback,aabbMin,aabbMax);

                }

                if (shape->getShapeType() == CONVEX_TRIANGLEMESH_SHAPE_PROXYTYPE)
                {
                    btConvexTriangleMeshShape* convexMesh = (btConvexTriangleMeshShape*) shape;
                    //todo: pass camera for some culling			
                    btVector3 aabbMax(btScalar(BT_LARGE_FLOAT),btScalar(BT_LARGE_FLOAT),btScalar(BT_LARGE_FLOAT));
                    btVector3 aabbMin(btScalar(-BT_LARGE_FLOAT),btScalar(-BT_LARGE_FLOAT),btScalar(-BT_LARGE_FLOAT));
                    //DebugDrawcallback drawCallback;
                    DebugDrawcallback drawCallback(getDebugDrawer(),worldTransform,color);
                    convexMesh->getMeshInterface()->InternalProcessAllTriangles(&drawCallback,aabbMin,aabbMax);
                }


                
            }
       
		}
	}
}